

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

float glu::TextureTestUtil::computeLodFromDerivates(LodMode mode,float dudx,float dudy)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = 0.0;
  if (mode < LODMODE_LAST) {
    uVar1 = -(uint)(-dudx <= dudx);
    fVar3 = (float)(uVar1 & (uint)dudx | ~uVar1 & (uint)-dudx);
    uVar1 = -(uint)(-dudy <= dudy);
    fVar2 = (float)(uVar1 & (uint)dudy | ~uVar1 & (uint)-dudy);
    uVar1 = -(uint)(fVar2 <= fVar3);
    fVar2 = (float)(~uVar1 & (uint)fVar2 | uVar1 & (uint)fVar3);
  }
  fVar2 = logf(fVar2);
  return fVar2 * 1.442695;
}

Assistant:

float computeLodFromDerivates (LodMode mode, float dudx, float dudy)
{
	float p = 0.0f;
	switch (mode)
	{
		// \note [mika] Min and max bounds equal to exact with 1D textures
		case LODMODE_EXACT:
		case LODMODE_MIN_BOUND:
		case LODMODE_MAX_BOUND:
			p = de::max(deFloatAbs(dudx), deFloatAbs(dudy));
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	return deFloatLog2(p);
}